

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O1

void __thiscall hwnet::any::_destroy(any *this)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = this->counter;
  if (((piVar2 != (int *)0x0) && (this->content != (placeholder *)0x0)) &&
     (iVar1 = *piVar2, *piVar2 = iVar1 + -1, iVar1 < 2)) {
    operator_delete(piVar2,4);
    if (this->content != (placeholder *)0x0) {
      (*this->content->_vptr_placeholder[1])();
      return;
    }
  }
  return;
}

Assistant:

void _destroy()
	{
		if(counter && content && --*counter <= 0)
		{
			delete counter;
			delete content;
		}
	}